

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

string * leveldb::LockFileName(string *__return_storage_ptr__,string *dbname)

{
  string *dbname_local;
  
  std::operator+(__return_storage_ptr__,dbname,"/LOCK");
  return __return_storage_ptr__;
}

Assistant:

std::string LockFileName(const std::string& dbname) { return dbname + "/LOCK"; }